

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,bool transformRows)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  HighsInt HVar4;
  pointer pHVar5;
  reference pvVar6;
  reference pvVar7;
  ValueType *pVVar8;
  reference this_00;
  int *piVar9;
  double *pdVar10;
  byte in_DL;
  HighsMipSolver *in_RSI;
  HighsCliqueTable *in_RDI;
  HighsHashTableEntry<int,_double> *pHVar11;
  double dVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double val_2;
  HighsInt col_3;
  HighsHashTableEntry<int,_double> *entry_1;
  iterator __end3_1;
  iterator __begin3_1;
  HighsHashTable<int,_double> *__range3_1;
  HighsInt nbin_1;
  bool freevar_1;
  double val_1;
  HighsInt col_2;
  HighsHashTableEntry<int,_double> *entry;
  iterator __end3;
  iterator __begin3;
  HighsHashTable<int,_double> *__range3;
  HighsInt nbin;
  bool freevar;
  double val;
  HighsInt col_1;
  HighsInt j_1;
  bool equality;
  HighsInt col;
  HighsInt j;
  bool issetppc;
  HighsInt end;
  HighsInt start;
  HighsInt i;
  HighsDomain *globaldom;
  double rhs;
  double offset;
  HighsHashTable<int,_double> entries;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<int,_std::allocator<int>_> perm;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> inds;
  value_type_conflict1 *in_stack_fffffffffffffcc8;
  HighsDomain *in_stack_fffffffffffffcd0;
  undefined7 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdf;
  HighsMipSolver *in_stack_fffffffffffffce0;
  HighsInt *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  HighsHashTable<int,_double> *in_stack_fffffffffffffd38;
  HashTableIterator<HighsHashTableEntry<int,_double>_> local_1b8;
  HashTableIterator<HighsHashTableEntry<int,_double>_> local_1a0;
  undefined1 *local_188;
  int local_180;
  byte local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  double local_178;
  double local_170;
  int local_164;
  HighsHashTableEntry<int,_double> *local_160;
  HashTableIterator<HighsHashTableEntry<int,_double>_> local_158;
  HashTableIterator<HighsHashTableEntry<int,_double>_> local_140;
  undefined1 *local_128;
  int local_120;
  byte local_119;
  double local_118;
  value_type local_10c;
  value_type local_108;
  undefined4 local_104;
  undefined1 local_fd;
  undefined4 local_fc;
  int local_f8;
  value_type local_f4;
  byte local_ed;
  value_type local_ec;
  value_type local_e8;
  int local_e4;
  HighsDomain *local_e0;
  HighsInt *local_d8;
  double local_d0;
  undefined1 local_b8 [28];
  HighsInt in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff6b;
  HighsInt in_stack_ffffffffffffff6c;
  CliqueVar *in_stack_ffffffffffffff70;
  HighsMipSolver *in_stack_ffffffffffffff78;
  HighsCliqueTable *in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff98;
  HighsInt in_stack_ffffffffffffffa4;
  pointer in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  HighsMipSolver *in_stack_ffffffffffffffc8;
  HighsCliqueTable *in_stack_ffffffffffffffd0;
  pointer in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar2 = in_DL & 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5385bf);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5385cc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5385d9);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x5385e6);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x5385f3);
  HighsHashTable<int,_double>::HighsHashTable
            ((HighsHashTable<int,_double> *)in_stack_fffffffffffffce0);
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x538616);
  local_e0 = &pHVar5->domain;
  for (local_e4 = 0; iVar1 = local_e4, HVar4 = HighsMipSolver::numRow(in_RSI), iVar1 != HVar4;
      local_e4 = local_e4 + 1) {
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x53867d);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&pHVar5->ARstart_,(long)local_e4);
    local_e8 = *pvVar6;
    pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x5386b1);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&pHVar5->ARstart_,(long)(local_e4 + 1));
    local_ec = *pvVar6;
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x5386e9)
    ;
    HVar4 = presolve::HighsPostsolveStack::getOrigRowIndex
                      ((HighsPostsolveStack *)in_stack_fffffffffffffcd0,
                       (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    if (in_RSI->orig_model_->num_row_ <= HVar4) break;
    dVar12 = HighsMipSolver::rowUpper
                       ((HighsMipSolver *)in_stack_fffffffffffffcd0,
                        (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    if ((dVar12 != 1.0) || (NAN(dVar12))) {
LAB_00538a29:
      if (((bVar2 & 1) != 0) && (bVar3 = isFull(in_RDI), !bVar3)) {
        local_d0 = 0.0;
        for (local_108 = local_e8; local_108 != local_ec; local_108 = local_108 + 1) {
          pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x538a9d);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&pHVar5->ARindex_,(long)local_108);
          local_10c = *pvVar6;
          pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x538ad1);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar5->ARvalue_,(long)local_108);
          local_118 = *pvVar7;
          resolveSubstitution((HighsCliqueTable *)
                              CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                              in_stack_fffffffffffffce8,(double *)in_stack_fffffffffffffce0,
                              (double *)
                              CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
          dVar12 = local_118;
          pVVar8 = HighsHashTable<int,_double>::operator[]
                             (in_stack_fffffffffffffd38,
                              (KeyType_conflict *)
                              CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
          *pVVar8 = dVar12 + *pVVar8;
        }
        dVar12 = HighsMipSolver::rowUpper
                           ((HighsMipSolver *)in_stack_fffffffffffffcd0,
                            (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        if ((dVar12 != INFINITY) || (NAN(dVar12))) {
          dVar12 = HighsMipSolver::rowUpper
                             ((HighsMipSolver *)in_stack_fffffffffffffcd0,
                              (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
          local_d8 = (HighsInt *)(dVar12 - local_d0);
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)0x538c0a);
          std::vector<double,_std::allocator<double>_>::clear
                    ((vector<double,_std::allocator<double>_> *)0x538c17);
          std::vector<signed_char,_std::allocator<signed_char>_>::clear
                    ((vector<signed_char,_std::allocator<signed_char>_> *)0x538c24);
          local_119 = 0;
          local_120 = 0;
          local_128 = local_b8;
          HighsHashTable<int,_double>::begin
                    ((HighsHashTable<int,_double> *)
                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          HighsHashTable<int,_double>::end
                    ((HighsHashTable<int,_double> *)
                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          while (bVar3 = HighsHashTable<int,_double>::
                         HashTableIterator<HighsHashTableEntry<int,_double>_>::operator!=
                                   (&local_140,&local_158), bVar3) {
            local_160 = HighsHashTable<int,_double>::
                        HashTableIterator<HighsHashTableEntry<int,_double>_>::operator*(&local_140);
            piVar9 = HighsHashTableEntry<int,_double>::key(local_160);
            local_164 = *piVar9;
            pHVar11 = local_160;
            pdVar10 = HighsHashTableEntry<int,_double>::value(local_160);
            local_170 = *pdVar10;
            std::abs((int)pHVar11);
            pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x538d4d);
            if (pHVar5->epsilon <= extraout_XMM0_Qa) {
              bVar3 = HighsDomain::isBinary
                                (in_stack_fffffffffffffcd0,
                                 (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
              if (bVar3) {
                local_120 = local_120 + 1;
              }
              if (0.0 <= local_170) {
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_lower_,(long)local_164);
                if ((*pvVar7 == -INFINITY) && (!NAN(*pvVar7))) {
                  local_119 = 1;
                  break;
                }
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0,
                           (value_type_conflict1 *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0,
                           (value_type_conflict2 *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
                local_17a = 1;
                std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                          ((vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_fffffffffffffcd0,
                           (value_type_conflict *)in_stack_fffffffffffffcc8);
                dVar12 = local_170;
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_lower_,(long)local_164);
                local_d8 = (HighsInt *)(-dVar12 * *pvVar7 + (double)local_d8);
              }
              else {
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_upper_,(long)local_164);
                if ((*pvVar7 == INFINITY) && (!NAN(*pvVar7))) {
                  local_119 = 1;
                  break;
                }
                local_178 = -local_170;
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcd0,
                           in_stack_fffffffffffffcc8);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0,
                           (value_type_conflict2 *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
                local_179 = 0xff;
                std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                          ((vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_fffffffffffffcd0,
                           (value_type_conflict *)in_stack_fffffffffffffcc8);
                dVar12 = local_170;
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_upper_,(long)local_164);
                local_d8 = (HighsInt *)(-dVar12 * *pvVar7 + (double)local_d8);
              }
            }
            HighsHashTable<int,_double>::HashTableIterator<HighsHashTableEntry<int,_double>_>::
            operator++(&local_140);
          }
          if (((local_119 & 1) == 0) && (local_120 != 0)) {
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x539032);
            in_stack_fffffffffffffcd0 = (HighsDomain *)&stack0xffffffffffffff70;
            in_stack_fffffffffffffcc8 = (value_type_conflict1 *)&stack0xffffffffffffffa0;
            extractCliques(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                           (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb8,
                           (vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa4,
                           (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0,
                           (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)CONCAT17(bVar2,in_stack_ffffffffffffffe8),
                           (double)in_stack_ffffffffffffff98);
            bVar3 = HighsDomain::infeasible(local_e0);
            if (bVar3) {
              local_104 = 1;
              goto LAB_005395fa;
            }
          }
        }
        dVar12 = HighsMipSolver::rowLower
                           ((HighsMipSolver *)in_stack_fffffffffffffcd0,
                            (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        if ((dVar12 != -INFINITY) || (NAN(dVar12))) {
          in_stack_fffffffffffffd38 =
               (HighsHashTable<int,_double> *)
               HighsMipSolver::rowLower
                         ((HighsMipSolver *)in_stack_fffffffffffffcd0,
                          (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
          local_d8 = (HighsInt *)(local_d0 - (double)in_stack_fffffffffffffd38);
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)0x539147);
          std::vector<double,_std::allocator<double>_>::clear
                    ((vector<double,_std::allocator<double>_> *)0x539154);
          std::vector<signed_char,_std::allocator<signed_char>_>::clear
                    ((vector<signed_char,_std::allocator<signed_char>_> *)0x539161);
          local_17b = 0;
          local_180 = 0;
          local_188 = local_b8;
          HighsHashTable<int,_double>::begin
                    ((HighsHashTable<int,_double> *)
                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          HighsHashTable<int,_double>::end
                    ((HighsHashTable<int,_double> *)
                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          while (in_stack_fffffffffffffd37 =
                      HighsHashTable<int,_double>::
                      HashTableIterator<HighsHashTableEntry<int,_double>_>::operator!=
                                (&local_1a0,&local_1b8), (bool)in_stack_fffffffffffffd37) {
            this_00 = HighsHashTable<int,_double>::
                      HashTableIterator<HighsHashTableEntry<int,_double>_>::operator*(&local_1a0);
            piVar9 = HighsHashTableEntry<int,_double>::key(this_00);
            iVar1 = *piVar9;
            pdVar10 = HighsHashTableEntry<int,_double>::value(this_00);
            dVar12 = -*pdVar10;
            std::abs((int)this_00);
            pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x53927a);
            if (pHVar5->epsilon <= extraout_XMM0_Qa_00) {
              bVar3 = HighsDomain::isBinary
                                (in_stack_fffffffffffffcd0,
                                 (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
              if (bVar3) {
                local_180 = local_180 + 1;
              }
              if (0.0 <= dVar12) {
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_lower_,(long)iVar1);
                if ((*pvVar7 == -INFINITY) && (!NAN(*pvVar7))) {
                  local_17b = 1;
                  break;
                }
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0,
                           (value_type_conflict1 *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0,
                           (value_type_conflict2 *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
                std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                          ((vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_fffffffffffffcd0,
                           (value_type_conflict *)in_stack_fffffffffffffcc8);
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_lower_,(long)iVar1);
                local_d8 = (HighsInt *)(-dVar12 * *pvVar7 + (double)local_d8);
              }
              else {
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_upper_,(long)iVar1);
                if ((*pvVar7 == INFINITY) && (!NAN(*pvVar7))) {
                  local_17b = 1;
                  break;
                }
                std::vector<double,_std::allocator<double>_>::push_back
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcd0,
                           in_stack_fffffffffffffcc8);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0,
                           (value_type_conflict2 *)
                           CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8));
                std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                          ((vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_fffffffffffffcd0,
                           (value_type_conflict *)in_stack_fffffffffffffcc8);
                pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&local_e0->col_upper_,(long)iVar1);
                local_d8 = (HighsInt *)(-dVar12 * *pvVar7 + (double)local_d8);
              }
            }
            HighsHashTable<int,_double>::HashTableIterator<HighsHashTableEntry<int,_double>_>::
            operator++(&local_1a0);
          }
          if (((local_17b & 1) == 0) && (local_180 != 0)) {
            in_stack_fffffffffffffce0 = in_RSI;
            in_stack_fffffffffffffce8 = local_d8;
            in_stack_fffffffffffffcf4 = local_180;
            std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
            operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                       0x539541);
            in_stack_fffffffffffffcd0 = (HighsDomain *)&stack0xffffffffffffff70;
            in_stack_fffffffffffffcc8 = (value_type_conflict1 *)&stack0xffffffffffffffa0;
            extractCliques(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                           (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc0,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb8,
                           (vector<signed_char,_std::allocator<signed_char>_> *)
                           in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa4,
                           (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0,
                           (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)CONCAT17(bVar2,in_stack_ffffffffffffffe8),
                           (double)in_stack_ffffffffffffff98);
            in_stack_fffffffffffffcdf = HighsDomain::infeasible(local_e0);
            if ((bool)in_stack_fffffffffffffcdf) {
              local_104 = 1;
              goto LAB_005395fa;
            }
          }
        }
        HighsHashTable<int,_double>::clear((HighsHashTable<int,_double> *)in_stack_fffffffffffffcd0)
        ;
      }
    }
    else {
      local_ed = 1;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::clear
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x5387b9);
      for (local_f4 = local_e8; local_f4 != local_ec; local_f4 = local_f4 + 1) {
        pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5387ef);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&pHVar5->ARindex_,(long)local_f4);
        local_f8 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_e0->col_upper_,(long)local_f8);
        if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) {
LAB_0053886a:
          bVar3 = HighsDomain::isBinary
                            (in_stack_fffffffffffffcd0,
                             (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
          if (!bVar3) {
            local_ed = 0;
            break;
          }
          pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x5388b5);
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar5->ARvalue_,(long)local_f4);
          if ((*pvVar7 != 1.0) || (NAN(*pvVar7))) {
            local_ed = 0;
            break;
          }
          local_fc = 1;
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          emplace_back<int&,int>
                    ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)in_stack_fffffffffffffce0,
                     (int *)CONCAT17(in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd8),
                     (int *)in_stack_fffffffffffffcd0);
        }
        else {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_e0->col_lower_,(long)local_f8);
          if ((*pvVar7 != 0.0) || (NAN(*pvVar7))) goto LAB_0053886a;
        }
      }
      if ((local_ed & 1) == 0) goto LAB_00538a29;
      dVar12 = HighsMipSolver::rowLower
                         ((HighsMipSolver *)in_stack_fffffffffffffcd0,
                          (HighsInt)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      local_fd = dVar12 == 1.0;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::data
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)0x5389a4);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::size
                ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  *)&stack0xffffffffffffff70);
      addClique(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                in_stack_ffffffffffffff6c,(bool)in_stack_ffffffffffffff6b,in_stack_ffffffffffffff64)
      ;
      bVar3 = HighsDomain::infeasible(local_e0);
      if (bVar3) {
        local_104 = 1;
        goto LAB_005395fa;
      }
    }
  }
  local_104 = 0;
LAB_005395fa:
  HighsHashTable<int,_double>::~HighsHashTable
            ((HighsHashTable<int,_double> *)in_stack_fffffffffffffcd0);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::~vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             in_stack_fffffffffffffce0);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffce0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffce0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0);
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(HighsMipSolver& mipsolver,
                                      bool transformRows) {
  std::vector<HighsInt> inds;
  std::vector<double> vals;
  std::vector<HighsInt> perm;
  std::vector<int8_t> complementation;
  std::vector<CliqueVar> clique;
  HighsHashTable<HighsInt, double> entries;
  double offset;

  double rhs;

  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  for (HighsInt i = 0; i != mipsolver.numRow(); ++i) {
    HighsInt start = mipsolver.mipdata_->ARstart_[i];
    HighsInt end = mipsolver.mipdata_->ARstart_[i + 1];

    if (mipsolver.mipdata_->postSolveStack.getOrigRowIndex(i) >=
        mipsolver.orig_model_->num_row_)
      break;

    // catch set packing and partitioning constraints that already have the form
    // of a clique without transformations and add those cliques with the rows
    // being recorded
    if (mipsolver.rowUpper(i) == 1.0) {
      bool issetppc = true;

      clique.clear();

      for (HighsInt j = start; j != end; ++j) {
        HighsInt col = mipsolver.mipdata_->ARindex_[j];
        if (globaldom.col_upper_[col] == 0.0 &&
            globaldom.col_lower_[col] == 0.0)
          continue;
        if (!globaldom.isBinary(col)) {
          issetppc = false;
          break;
        }

        if (mipsolver.mipdata_->ARvalue_[j] != 1.0) {
          issetppc = false;
          break;
        }

        clique.emplace_back(col, 1);
      }

      if (issetppc) {
        bool equality = mipsolver.rowLower(i) == 1.0;
        addClique(mipsolver, clique.data(), clique.size(), equality, i);
        if (globaldom.infeasible()) return;
        continue;
      }
    }
    if (!transformRows || isFull()) continue;

    offset = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = mipsolver.mipdata_->ARindex_[j];
      double val = mipsolver.mipdata_->ARvalue_[j];

      resolveSubstitution(col, val, offset);
      entries[col] += val;
    }

    if (mipsolver.rowUpper(i) != kHighsInf) {
      rhs = mipsolver.rowUpper(i) - offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = entry.value();

        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    if (mipsolver.rowLower(i) != -kHighsInf) {
      rhs = -mipsolver.rowLower(i) + offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = -entry.value();
        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    entries.clear();
  }
}